

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::checkbox::load(checkbox *this,context *context)

{
  uint *puVar1;
  __type _Var2;
  request *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var3;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar4;
  key_type local_40;
  
  base_widget::pre_load
            ((base_widget *)
             ((long)&(this->super_base_html_input)._vptr_base_html_input +
             (long)(this->super_base_html_input)._vptr_base_html_input[-3]),context);
  puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                   (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
  *puVar1 = *puVar1 | 2;
  this_00 = http::context::request(context);
  this_01 = &http::request::post_or_get_abi_cxx11_(this_00)->_M_t;
  std::__cxx11::string::string
            ((string *)&local_40,
             (string *)
             ((this->super_base_html_input)._vptr_base_html_input[-3] + 0x18 +
             (long)&(this->super_base_html_input).type_._M_dataplus));
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(this_01,&local_40);
  _Var3 = pVar4.first._M_node;
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_base_html_input).field_0x58 = 0;
  while( true ) {
    if (_Var3._M_node == pVar4.second._M_node._M_node) {
      return;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (_Var3._M_node + 2),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(this->super_base_html_input).field_0x38);
    if (_Var2) break;
    _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
  }
  (this->super_base_html_input).field_0x58 = 1;
  return;
}

Assistant:

void checkbox::load(http::context &context)
{
	pre_load(context);
	set(true);
	std::pair<http::request::form_type::const_iterator,http::request::form_type::const_iterator> 
		range=context.request().post_or_get().equal_range(name());
	value(false);
	while(range.first != range.second) {
		if(range.first->second == identification_) {
			value(true);
			break;
		}
		++range.first;
	}
}